

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_opendir(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_context *pCtx_00;
  int iVar1;
  char *pcVar2;
  undefined8 local_68;
  int local_44;
  int rc;
  int iLen;
  io_private *pDev;
  char *zPath;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pStream = (jx9_io_stream *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pjStack_18,2,"Expecting a directory path");
    jx9_result_bool(pjStack_18,0);
  }
  else {
    pDev = (io_private *)jx9_value_to_string((jx9_value *)pStream->zName,&local_44);
    zPath = (char *)jx9VmGetStreamDevice(pjStack_18->pVm,(char **)&pDev,local_44);
    pCtx_00 = pjStack_18;
    if ((jx9_io_stream *)zPath == (jx9_io_stream *)0x0) {
      jx9_context_throw_error_format
                (pjStack_18,2,"No stream device is associated with the given path(%s)",pDev);
      jx9_result_bool(pjStack_18,0);
    }
    else if (((jx9_io_stream *)zPath)->xOpenDir ==
             (_func_int_char_ptr_jx9_value_ptr_void_ptr_ptr *)0x0) {
      pcVar2 = jx9_function_name(pjStack_18);
      jx9_context_throw_error_format
                (pCtx_00,2,"IO routine(%s) not implemented in the underlying stream(%s) device",
                 pcVar2,*(undefined8 *)zPath);
      jx9_result_bool(pjStack_18,0);
    }
    else {
      _rc = (io_private *)jx9_context_alloc_chunk(pjStack_18,0x38,1,0);
      if (_rc == (io_private *)0x0) {
        jx9_context_throw_error(pjStack_18,1,"JX9 is running out of memory");
        jx9_result_bool(pjStack_18,0);
      }
      else {
        InitIOPrivate(pjStack_18->pVm,(jx9_io_stream *)zPath,_rc);
        if (apArg_local._4_4_ < 2) {
          local_68 = 0;
        }
        else {
          local_68 = *(undefined8 *)&pStream->iVersion;
        }
        iVar1 = (**(code **)(zPath + 0x18))(pDev,local_68,&_rc->pHandle);
        if (iVar1 == 0) {
          jx9_result_resource(pjStack_18,_rc);
        }
        else {
          ReleaseIOPrivate(pjStack_18,_rc);
          jx9_result_bool(pjStack_18,0);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_opendir(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zPath;
	io_private *pDev;
	int iLen, rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a directory path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target path */
	zPath  = jx9_value_to_string(apArg[0], &iLen);
	/* Try to extract a stream */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zPath, iLen);
	if( pStream == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"No stream device is associated with the given path(%s)", zPath);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( pStream->xOpenDir == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device", 
			jx9_function_name(pCtx), pStream->zName
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Allocate a new IO private instance */
	pDev = (io_private *)jx9_context_alloc_chunk(pCtx, sizeof(io_private), TRUE, FALSE);
	if( pDev == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Initialize the structure */
	InitIOPrivate(pCtx->pVm, pStream, pDev);
	/* Open the target directory */
	rc = pStream->xOpenDir(zPath, nArg > 1 ? apArg[1] : 0, &pDev->pHandle);
	if( rc != JX9_OK ){
		/* IO error, return FALSE */
		ReleaseIOPrivate(pCtx, pDev);
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return the handle as a resource */
		jx9_result_resource(pCtx, pDev);
	}
	return JX9_OK;
}